

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void setsvar(char *name,char *str,bool dofunc)

{
  uint uVar1;
  ident *piVar2;
  size_t sVar3;
  char *__dest;
  identstack *piVar4;
  char *local_38;
  
  local_38 = name;
  piVar2 = hashset<ident>::access<char_const*>(&idents,&local_38);
  if (piVar2 == (ident *)0x0) {
    return;
  }
  if (piVar2->type != 2) {
    return;
  }
  uVar1 = piVar2->flags;
  if ((uVar1 & 2) == 0 && (identflags & 0x10U) == 0) {
    if ((uVar1 & 0x10) != 0) {
      if ((piVar2->field_5).stack != (identstack *)0x0) {
        operator_delete__((piVar2->field_5).stack);
        uVar1 = piVar2->flags;
      }
      piVar2->flags = uVar1 & 0xffffffef;
    }
    piVar4 = *(identstack **)(piVar2->field_4).args;
  }
  else {
    if ((uVar1 & 1) != 0) {
      debugcode("cannot override persistent variable %s",piVar2->name);
      return;
    }
    piVar4 = *(identstack **)(piVar2->field_4).args;
    if ((uVar1 & 0x10) == 0) {
      (piVar2->field_5).stack = piVar4;
      piVar2->flags = uVar1 | 0x10;
      goto LAB_001274fb;
    }
  }
  if (piVar4 != (identstack *)0x0) {
    operator_delete__(piVar4);
  }
LAB_001274fb:
  sVar3 = strlen(str);
  __dest = (char *)operator_new__(sVar3 + 1);
  strncpy(__dest,str,sVar3 + 1);
  __dest[sVar3] = '\0';
  *(char **)(piVar2->field_4).args = __dest;
  if ((dofunc) && (piVar2->fun != (identfun)0x0)) {
    (*piVar2->fun)();
  }
  return;
}

Assistant:

void setsvar(const char *name, const char *str, bool dofunc)
{
    _GETVAR(id, ID_SVAR, name, );
    OVERRIDEVAR(return, id->overrideval.s = *id->storage.s, delete[] id->overrideval.s, delete[] *id->storage.s);
    *id->storage.s = newstring(str);
    if(dofunc) id->changed();
}